

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtcl(fitsfile *fptr,int colnum,int *typecode,long *repeat,long *width,int *status)

{
  LONGLONG local_50;
  LONGLONG twidth;
  LONGLONG trepeat;
  int *status_local;
  long *width_local;
  long *repeat_local;
  int *typecode_local;
  fitsfile *pfStack_18;
  int colnum_local;
  fitsfile *fptr_local;
  
  trepeat = (LONGLONG)status;
  status_local = (int *)width;
  width_local = repeat;
  repeat_local = (long *)typecode;
  typecode_local._4_4_ = colnum;
  pfStack_18 = fptr;
  ffgtclll(fptr,colnum,typecode,&twidth,&local_50,status);
  if (*(int *)trepeat < 1) {
    if (width_local != (long *)0x0) {
      *width_local = twidth;
    }
    if (status_local != (int *)0x0) {
      *(LONGLONG *)status_local = local_50;
    }
    fptr_local._4_4_ = *(int *)trepeat;
  }
  else {
    fptr_local._4_4_ = *(int *)trepeat;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgtcl( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            long *repeat,    /* O - repeat count of field                   */
            long *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get Type of table column. 
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    LONGLONG trepeat, twidth;
    
    ffgtclll(fptr, colnum, typecode, &trepeat, &twidth, status);

    if (*status > 0)
        return(*status);
	
    if (repeat)
        *repeat= (long) trepeat;
      
    if (width)
        *width = (long) twidth;
    
    return(*status);
}